

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFormatItemForReport
                    (xmlChar **buf,xmlChar *itemDes,xmlSchemaBasicItemPtr item,xmlNodePtr itemNode)

{
  int iVar1;
  bool bVar2;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *local_70;
  xmlNodePtr elem_1;
  xmlSchemaElementPtr elem;
  xmlSchemaAttributePtr_conflict attr;
  xmlSchemaAttributeUsePtr_conflict ause;
  xmlSchemaTypePtr type_2;
  xmlSchemaTypePtr type_1;
  xmlSchemaTypePtr type;
  xmlChar *pxStack_30;
  int named;
  xmlChar *str;
  xmlNodePtr itemNode_local;
  xmlSchemaBasicItemPtr item_local;
  xmlChar *itemDes_local;
  xmlChar **buf_local;
  
  pxStack_30 = (xmlChar *)0x0;
  bVar2 = true;
  str = (xmlChar *)itemNode;
  itemNode_local = (xmlNodePtr)item;
  item_local = (xmlSchemaBasicItemPtr)itemDes;
  itemDes_local = (xmlChar *)buf;
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    itemDes_local[0] = '\0';
    itemDes_local[1] = '\0';
    itemDes_local[2] = '\0';
    itemDes_local[3] = '\0';
    itemDes_local[4] = '\0';
    itemDes_local[5] = '\0';
    itemDes_local[6] = '\0';
    itemDes_local[7] = '\0';
  }
  pxVar3 = itemNode_local;
  if (item_local != (xmlSchemaBasicItemPtr)0x0) {
    pxVar4 = xmlStrdup((xmlChar *)item_local);
    *(xmlChar **)itemDes_local = pxVar4;
    goto LAB_001d99a4;
  }
  if (itemNode_local == (xmlNodePtr)0x0) {
    bVar2 = false;
    goto LAB_001d99a4;
  }
  iVar1 = *(int *)&itemNode_local->_private;
  if (iVar1 == 1) {
    if (((ulong)itemNode_local->properties & 0x100) == 0) {
      if (((ulong)itemNode_local->properties & 0x40) == 0) {
        if (((ulong)itemNode_local->properties & 0x80) == 0) {
          pxVar4 = xmlStrdup((xmlChar *)"simple type \'xs:");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        else {
          pxVar4 = xmlStrdup((xmlChar *)"union type \'xs:");
          *(xmlChar **)itemDes_local = pxVar4;
        }
      }
      else {
        pxVar4 = xmlStrdup((xmlChar *)"list type \'xs:");
        *(xmlChar **)itemDes_local = pxVar4;
      }
    }
    else {
      pxVar4 = xmlStrdup((xmlChar *)"atomic type \'xs:");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,pxVar3->name);
    *(xmlChar **)itemDes_local = pxVar4;
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
    *(xmlChar **)itemDes_local = pxVar4;
    goto LAB_001d99a4;
  }
  if (iVar1 == 2) {
LAB_001d9776:
    pxVar4 = xmlSchemaWildcardPCToString(*(int *)&itemNode_local->parent);
    pxVar4 = xmlStrdup(pxVar4);
    *(xmlChar **)itemDes_local = pxVar4;
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," wildcard");
    *(xmlChar **)itemDes_local = pxVar4;
    goto LAB_001d99a4;
  }
  if (iVar1 == 4) {
    if (((ulong)itemNode_local->properties & 8) == 0) {
      pxVar4 = xmlStrdup("local ");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    else {
      pxVar4 = xmlStrdup("");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    if (((ulong)pxVar3->properties & 0x100) == 0) {
      if (((ulong)pxVar3->properties & 0x40) == 0) {
        if (((ulong)pxVar3->properties & 0x80) == 0) {
          pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"simple type");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        else {
          pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"union type");
          *(xmlChar **)itemDes_local = pxVar4;
        }
      }
      else {
        pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"list type");
        *(xmlChar **)itemDes_local = pxVar4;
      }
    }
    else {
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,(xmlChar *)"atomic type");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    if (((ulong)pxVar3->properties & 8) != 0) {
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,pxVar3->name);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    goto LAB_001d99a4;
  }
  if (iVar1 == 5) {
    if (((ulong)itemNode_local->properties & 8) == 0) {
      pxVar4 = xmlStrdup("local ");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    else {
      pxVar4 = xmlStrdup("");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"complex type");
    *(xmlChar **)itemDes_local = pxVar4;
    if (((ulong)pxVar3->properties & 8) != 0) {
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,pxVar3->name);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
    }
    goto LAB_001d99a4;
  }
  if (iVar1 - 6U < 3) {
LAB_001d98c8:
    pxVar4 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)itemNode_local);
    pxVar4 = xmlStrdup(pxVar4);
    *(xmlChar **)itemDes_local = pxVar4;
  }
  else {
    if (iVar1 == 0xe) {
      pxVar4 = xmlStrdup((xmlChar *)"element decl.");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaFormatQName(&stack0xffffffffffffffd0,(xmlChar *)pxVar3->nsDef,pxVar3->name);
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
      goto LAB_001d99a4;
    }
    if (iVar1 == 0xf) {
      pxVar4 = xmlStrdup((xmlChar *)"attribute decl.");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaFormatQName
                         (&stack0xffffffffffffffd0,*(xmlChar **)&pxVar3->line,pxVar3->name);
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      if (pxStack_30 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_30);
        pxStack_30 = (xmlChar *)0x0;
      }
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
      goto LAB_001d99a4;
    }
    if (iVar1 == 0x10) {
      xmlSchemaGetComponentDesignation((xmlChar **)itemDes_local,itemNode_local);
      goto LAB_001d99a4;
    }
    if (iVar1 == 0x11) {
      pxVar4 = xmlStrdup((xmlChar *)"model group def.");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaGetComponentQName(&stack0xffffffffffffffd0,itemNode_local);
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
      if (pxStack_30 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_30);
        pxStack_30 = (xmlChar *)0x0;
      }
      goto LAB_001d99a4;
    }
    if (iVar1 == 0x12) {
      pxVar4 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)itemNode_local);
      pxVar4 = xmlStrdup(pxVar4);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local," \'");
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaGetComponentQName(&stack0xffffffffffffffd0,itemNode_local);
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
      *(xmlChar **)itemDes_local = pxVar4;
      if (pxStack_30 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_30);
        pxStack_30 = (xmlChar *)0x0;
      }
    }
    else {
      if (iVar1 == 0x15) goto LAB_001d9776;
      if (iVar1 - 0x16U < 3) {
        if (*(int *)&itemNode_local->_private == 0x16) {
          pxVar4 = xmlStrdup((xmlChar *)"unique \'");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        else if (*(int *)&itemNode_local->_private == 0x17) {
          pxVar4 = xmlStrdup((xmlChar *)"key \'");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        else {
          pxVar4 = xmlStrdup((xmlChar *)"keyRef \'");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,(xmlChar *)itemNode_local->last);
        *(xmlChar **)itemDes_local = pxVar4;
        pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
        *(xmlChar **)itemDes_local = pxVar4;
        goto LAB_001d99a4;
      }
      if (iVar1 == 0x19) goto LAB_001d98c8;
      if (iVar1 == 0x1a) {
        pxVar4 = xmlStrdup((xmlChar *)"attribute use ");
        *(xmlChar **)itemDes_local = pxVar4;
        if (pxVar3->children == (_xmlNode *)0x0) {
          pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,(xmlChar *)"(unknown)");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        else {
          pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
          *(xmlChar **)itemDes_local = pxVar4;
          pxVar4 = *(xmlChar **)itemDes_local;
          pxVar5 = xmlSchemaGetComponentQName(&stack0xffffffffffffffd0,pxVar3->children);
          pxVar4 = xmlStrcat(pxVar4,pxVar5);
          *(xmlChar **)itemDes_local = pxVar4;
          if (pxStack_30 != (xmlChar *)0x0) {
            (*xmlFree)(pxStack_30);
            pxStack_30 = (xmlChar *)0x0;
          }
          pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
          *(xmlChar **)itemDes_local = pxVar4;
        }
        goto LAB_001d99a4;
      }
      if (iVar1 - 1000U < 0xc) {
        pxVar4 = xmlStrdup((xmlChar *)"facet \'");
        *(xmlChar **)itemDes_local = pxVar4;
        pxVar4 = *(xmlChar **)itemDes_local;
        pxVar5 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)&itemNode_local->_private);
        pxVar4 = xmlStrcat(pxVar4,pxVar5);
        *(xmlChar **)itemDes_local = pxVar4;
        pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
        *(xmlChar **)itemDes_local = pxVar4;
        goto LAB_001d99a4;
      }
    }
    bVar2 = false;
  }
LAB_001d99a4:
  if ((!bVar2) && (str != (xmlChar *)0x0)) {
    if (*(int *)(str + 8) == 2) {
      local_70 = *(xmlChar **)(str + 0x28);
    }
    else {
      local_70 = str;
    }
    pxVar4 = xmlStrdup((xmlChar *)"Element \'");
    *(xmlChar **)itemDes_local = pxVar4;
    if (*(long *)(local_70 + 0x48) == 0) {
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,*(xmlChar **)(local_70 + 0x10));
      *(xmlChar **)itemDes_local = pxVar4;
    }
    else {
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaFormatQName
                         (&stack0xffffffffffffffd0,*(xmlChar **)(*(long *)(local_70 + 0x48) + 0x10),
                          *(xmlChar **)(local_70 + 0x10));
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      if (pxStack_30 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_30);
        pxStack_30 = (xmlChar *)0x0;
      }
    }
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
    *(xmlChar **)itemDes_local = pxVar4;
  }
  if ((str != (xmlChar *)0x0) && (*(int *)(str + 8) == 2)) {
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,(xmlChar *)", attribute \'");
    *(xmlChar **)itemDes_local = pxVar4;
    if (*(long *)(str + 0x48) == 0) {
      pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,*(xmlChar **)(str + 0x10));
      *(xmlChar **)itemDes_local = pxVar4;
    }
    else {
      pxVar4 = *(xmlChar **)itemDes_local;
      pxVar5 = xmlSchemaFormatQName
                         (&stack0xffffffffffffffd0,*(xmlChar **)(*(long *)(str + 0x48) + 0x10),
                          *(xmlChar **)(str + 0x10));
      pxVar4 = xmlStrcat(pxVar4,pxVar5);
      *(xmlChar **)itemDes_local = pxVar4;
      if (pxStack_30 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_30);
        pxStack_30 = (xmlChar *)0x0;
      }
    }
    pxVar4 = xmlStrcat(*(xmlChar **)itemDes_local,"\'");
    *(xmlChar **)itemDes_local = pxVar4;
  }
  if (pxStack_30 != (xmlChar *)0x0) {
    (*xmlFree)(pxStack_30);
    pxStack_30 = (xmlChar *)0x0;
  }
  pxVar4 = xmlEscapeFormatString((xmlChar **)itemDes_local);
  return pxVar4;
}

Assistant:

static xmlChar*
xmlSchemaFormatItemForReport(xmlChar **buf,
		     const xmlChar *itemDes,
		     xmlSchemaBasicItemPtr item,
		     xmlNodePtr itemNode)
{
    xmlChar *str = NULL;
    int named = 1;

    if (*buf != NULL) {
	xmlFree(*buf);
	*buf = NULL;
    }

    if (itemDes != NULL) {
	*buf = xmlStrdup(itemDes);
    } else if (item != NULL) {
	switch (item->type) {
	case XML_SCHEMA_TYPE_BASIC: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrdup(BAD_CAST "atomic type 'xs:");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrdup(BAD_CAST "list type 'xs:");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrdup(BAD_CAST "union type 'xs:");
	    else
		*buf = xmlStrdup(BAD_CAST "simple type 'xs:");
	    *buf = xmlStrcat(*buf, type->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_SIMPLE: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrdup(BAD_CAST"");
	    } else {
		*buf = xmlStrdup(BAD_CAST "local ");
	    }
	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrcat(*buf, BAD_CAST "atomic type");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrcat(*buf, BAD_CAST "list type");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrcat(*buf, BAD_CAST "union type");
	    else
		*buf = xmlStrcat(*buf, BAD_CAST "simple type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_COMPLEX: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL)
		*buf = xmlStrdup(BAD_CAST "");
	    else
		*buf = xmlStrdup(BAD_CAST "local ");
	    *buf = xmlStrcat(*buf, BAD_CAST "complex type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE: {
		xmlSchemaAttributeUsePtr ause;

		ause = WXS_ATTR_USE_CAST item;
		*buf = xmlStrdup(BAD_CAST "attribute use ");
		if (WXS_ATTRUSE_DECL(ause) != NULL) {
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
		    *buf = xmlStrcat(*buf,
			xmlSchemaGetComponentQName(&str, WXS_ATTRUSE_DECL(ause)));
		    FREE_AND_NULL(str)
			*buf = xmlStrcat(*buf, BAD_CAST "'");
		} else {
		    *buf = xmlStrcat(*buf, BAD_CAST "(unknown)");
		}
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE: {
		xmlSchemaAttributePtr attr;

		attr = (xmlSchemaAttributePtr) item;
		*buf = xmlStrdup(BAD_CAST "attribute decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    attr->targetNamespace, attr->name));
		FREE_AND_NULL(str)
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    xmlSchemaGetComponentDesignation(buf, item);
	    break;
	case XML_SCHEMA_TYPE_ELEMENT: {
		xmlSchemaElementPtr elem;

		elem = (xmlSchemaElementPtr) item;
		*buf = xmlStrdup(BAD_CAST "element decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    elem->targetNamespace, elem->name));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    if (item->type == XML_SCHEMA_TYPE_IDC_UNIQUE)
		*buf = xmlStrdup(BAD_CAST "unique '");
	    else if (item->type == XML_SCHEMA_TYPE_IDC_KEY)
		*buf = xmlStrdup(BAD_CAST "key '");
	    else
		*buf = xmlStrdup(BAD_CAST "keyRef '");
	    *buf = xmlStrcat(*buf, ((xmlSchemaIDCPtr) item)->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_ANY:
	case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
	    *buf = xmlStrdup(xmlSchemaWildcardPCToString(
		    ((xmlSchemaWildcardPtr) item)->processContents));
	    *buf = xmlStrcat(*buf, BAD_CAST " wildcard");
	    break;
	case XML_SCHEMA_FACET_MININCLUSIVE:
	case XML_SCHEMA_FACET_MINEXCLUSIVE:
	case XML_SCHEMA_FACET_MAXINCLUSIVE:
	case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	case XML_SCHEMA_FACET_TOTALDIGITS:
	case XML_SCHEMA_FACET_FRACTIONDIGITS:
	case XML_SCHEMA_FACET_PATTERN:
	case XML_SCHEMA_FACET_ENUMERATION:
	case XML_SCHEMA_FACET_WHITESPACE:
	case XML_SCHEMA_FACET_LENGTH:
	case XML_SCHEMA_FACET_MAXLENGTH:
	case XML_SCHEMA_FACET_MINLENGTH:
	    *buf = xmlStrdup(BAD_CAST "facet '");
	    *buf = xmlStrcat(*buf, xmlSchemaFacetTypeToString(item->type));
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_GROUP: {
		*buf = xmlStrdup(BAD_CAST "model group def.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str)
	    }
	    break;
	case XML_SCHEMA_TYPE_SEQUENCE:
	case XML_SCHEMA_TYPE_CHOICE:
	case XML_SCHEMA_TYPE_ALL:
	case XML_SCHEMA_TYPE_PARTICLE:
	    *buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
	    break;
	case XML_SCHEMA_TYPE_NOTATION: {
		*buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str);
	    }
            /* Falls through. */
	default:
	    named = 0;
	}
    } else
	named = 0;

    if ((named == 0) && (itemNode != NULL)) {
	xmlNodePtr elem;

	if (itemNode->type == XML_ATTRIBUTE_NODE)
	    elem = itemNode->parent;
	else
	    elem = itemNode;
	*buf = xmlStrdup(BAD_CAST "Element '");
	if (elem->ns != NULL) {
	    *buf = xmlStrcat(*buf,
		xmlSchemaFormatQName(&str, elem->ns->href, elem->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, elem->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");

    }
    if ((itemNode != NULL) && (itemNode->type == XML_ATTRIBUTE_NODE)) {
	*buf = xmlStrcat(*buf, BAD_CAST ", attribute '");
	if (itemNode->ns != NULL) {
	    *buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		itemNode->ns->href, itemNode->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, itemNode->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");
    }
    FREE_AND_NULL(str)

    return (xmlEscapeFormatString(buf));
}